

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iutest::internal::CmpHelperEQ<long_double,long_double>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,longdouble *expected,longdouble *actual)

{
  string local_60;
  string local_40;
  
  if ((*expected != *(longdouble *)actual_str) || (NAN(*expected) || NAN(*(longdouble *)actual_str))
     ) {
    PrintToString<long_double>(&local_40,(longdouble *)actual_str);
    PrintToString<long_double>(&local_60,expected);
    EqFailure(__return_storage_ptr__,(char *)this,expected_str,&local_40,&local_60,false);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }